

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader_utilities.cpp
# Opt level: O2

void ShaderUtilities::attach_dir_light(GLuint p_shader_id,DirectionalLight *directional_light)

{
  allocator<char> local_51;
  vec3 local_50;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"material.shininess",(allocator<char> *)&local_50);
  setFloat(p_shader_id,&local_40,directional_light->m_shininess);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"directional_light.direction",(allocator<char> *)&local_50);
  setVec3(p_shader_id,&local_40,&directional_light->m_direction);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"directional_light.ambient",&local_51);
  if (LightingDbWindow::enable_dir_light == '\x01') {
    local_50.field_2 = (directional_light->m_phong).m_ambient.field_2;
    local_50.field_0 = (directional_light->m_phong).m_ambient.field_0;
    local_50.field_1 = (directional_light->m_phong).m_ambient.field_1;
  }
  else {
    local_50.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
    local_50.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
    local_50.field_2.z = 0.0;
  }
  setVec3(p_shader_id,&local_40,&local_50);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"directional_light.diffuse",&local_51);
  if (LightingDbWindow::enable_dir_light == '\x01') {
    local_50.field_2 = (directional_light->m_phong).m_diffuse.field_2;
    local_50.field_0 = (directional_light->m_phong).m_diffuse.field_0;
    local_50.field_1 = (directional_light->m_phong).m_diffuse.field_1;
  }
  else {
    local_50.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
    local_50.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
    local_50.field_2.z = 0.0;
  }
  setVec3(p_shader_id,&local_40,&local_50);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"directional_light.specular",&local_51);
  if (LightingDbWindow::enable_dir_light == '\x01') {
    local_50.field_2 = (directional_light->m_phong).m_specular.field_2;
    local_50.field_0 = (directional_light->m_phong).m_specular.field_0;
    local_50.field_1 = (directional_light->m_phong).m_specular.field_1;
  }
  else {
    local_50.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
    local_50.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
    local_50.field_2.z = 0.0;
  }
  setVec3(p_shader_id,&local_40,&local_50);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void ShaderUtilities::attach_dir_light(
    const GLuint p_shader_id,
    const DirectionalLight &directional_light) noexcept
{
    // TODO :: Shininess is actually part of Directional Light, as such, we need a separate Material helper class
    setFloat(
        p_shader_id,
        "material.shininess",
        directional_light.m_shininess);
    setVec3(
        p_shader_id,
        "directional_light.direction",
        directional_light.m_direction);
    setVec3(
        p_shader_id,
        "directional_light.ambient",
        LightingDbWindow::enable_dir_light ? directional_light.m_phong.m_ambient
                                           : glm::vec3(0.0f));
    setVec3(
        p_shader_id,
        "directional_light.diffuse",
        LightingDbWindow::enable_dir_light ? directional_light.m_phong.m_diffuse
                                           : glm::vec3(0.0f));
    setVec3(
        p_shader_id,
        "directional_light.specular",
        LightingDbWindow::enable_dir_light ? directional_light.m_phong.m_specular
                                           : glm::vec3(0.0f));
}